

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swab.cc
# Opt level: O0

void anon_unknown.dwarf_dd8::PrintUsage(ostream *stream)

{
  _Setw _Var1;
  ostream *poVar2;
  void *pvVar3;
  ostream *in_RDI;
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [8];
  ostream *in_stack_ffffffffffffffc8;
  string *in_stack_ffffffffffffffd0;
  
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI," swab - swap bytes");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  usage:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       swab [ options ] [ infile ] > stdout");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  options:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -S S  : start address      (   int)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0);
  poVar2 = std::operator<<(poVar2,"][ 0 <= S <= E ]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -s s  : start offset       (   int)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0);
  poVar2 = std::operator<<(poVar2,"][ 0 <= s <= e ]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -E E  : end address        (   int)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = std::operator<<(poVar2,"EOF");
  poVar2 = std::operator<<(poVar2,"][ S <= E <=   ]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -e e  : end offset         (   int)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = std::operator<<(poVar2,"EOF");
  poVar2 = std::operator<<(poVar2,"][ s <= e <=   ]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       +type : data type                  [");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = std::operator<<(poVar2,(anonymous_namespace)::kDefaultDataType);
  poVar2 = std::operator<<(poVar2,"]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RDI,"                 ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"s",&local_41);
  sptk::PrintDataType(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"S",&local_79);
  sptk::PrintDataType(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RDI,"                 ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"h",&local_a1);
  sptk::PrintDataType(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"H",&local_c9);
  sptk::PrintDataType(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RDI,"                 ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"i",&local_f1);
  sptk::PrintDataType(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"I",&local_119);
  sptk::PrintDataType(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RDI,"                 ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"l",&local_141);
  sptk::PrintDataType(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"L",&local_169);
  sptk::PrintDataType(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RDI,"                 ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"f",&local_191);
  sptk::PrintDataType(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"d",&local_1b9);
  sptk::PrintDataType(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RDI,"                 ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"e",&local_1e1);
  sptk::PrintDataType(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -h    : print this message");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  infile:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       data sequence              (  type)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = std::operator<<(poVar2,"stdin");
  poVar2 = std::operator<<(poVar2,"]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  stdout:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       swapped data sequence      (  type)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI," SPTK: version ");
  poVar2 = std::operator<<(poVar2,"4.3");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " swab - swap bytes" << std::endl;
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       swab [ options ] [ infile ] > stdout" << std::endl;
  *stream << "  options:" << std::endl;
  *stream << "       -S S  : start address      (   int)[" << std::setw(5) << std::right << kDefaultStartAddress << "][ 0 <= S <= E ]" << std::endl;  // NOLINT
  *stream << "       -s s  : start offset       (   int)[" << std::setw(5) << std::right << kDefaultStartOffset  << "][ 0 <= s <= e ]" << std::endl;  // NOLINT
  *stream << "       -E E  : end address        (   int)[" << std::setw(5) << std::right << "EOF"                << "][ S <= E <=   ]" << std::endl;  // NOLINT
  *stream << "       -e e  : end offset         (   int)[" << std::setw(5) << std::right << "EOF"                << "][ s <= e <=   ]" << std::endl;  // NOLINT
  *stream << "       +type : data type                  [" << std::setw(5) << std::right << kDefaultDataType     << "]" << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("s", stream); sptk::PrintDataType("S", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("h", stream); sptk::PrintDataType("H", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("i", stream); sptk::PrintDataType("I", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("l", stream); sptk::PrintDataType("L", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("f", stream); sptk::PrintDataType("d", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("e", stream);                                   *stream << std::endl;  // NOLINT
  *stream << "       -h    : print this message" << std::endl;
  *stream << "  infile:" << std::endl;
  *stream << "       data sequence              (  type)[" << std::setw(5) << std::right << "stdin" << "]" << std::endl;  // NOLINT
  *stream << "  stdout:" << std::endl;
  *stream << "       swapped data sequence      (  type)" << std::endl;
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}